

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_weapons.cpp
# Opt level: O0

AAmmo * __thiscall AWeapon::AddAmmo(AWeapon *this,AActor *other,PClassActor *ammotype,int amount)

{
  int iVar1;
  double dVar2;
  AWeapon *local_38;
  AAmmo *ammo;
  int amount_local;
  PClassActor *ammotype_local;
  AActor *other_local;
  AWeapon *this_local;
  
  if (ammotype == (PClassActor *)0x0) {
    this_local = (AWeapon *)0x0;
  }
  else {
    iVar1 = FIntCVar::operator_cast_to_int(&deathmatch);
    ammo._4_4_ = amount;
    if ((iVar1 != 0) && ((gameinfo.gametype & GAME_DoomChex) != GAME_Any)) {
      ammo._4_4_ = (amount * 5) / 2;
    }
    if (((this->super_AStateProvider).super_AInventory.ItemFlags & 0x4000) == 0) {
      dVar2 = G_SkillProperty(SKILLP_AmmoFactor);
      ammo._4_4_ = (int)((double)ammo._4_4_ * dVar2);
    }
    local_38 = (AWeapon *)AActor::FindInventory(other,ammotype,false);
    if (local_38 == (AWeapon *)0x0) {
      local_38 = (AWeapon *)Spawn(ammotype);
      iVar1 = MIN<int>(ammo._4_4_,(local_38->super_AStateProvider).super_AInventory.MaxAmount);
      (local_38->super_AStateProvider).super_AInventory.Amount = iVar1;
      (*(local_38->super_AStateProvider).super_AInventory.super_AActor.super_DThinker.super_DObject.
        _vptr_DObject[0x29])(local_38,other);
    }
    else if (((local_38->super_AStateProvider).super_AInventory.Amount <
              (local_38->super_AStateProvider).super_AInventory.MaxAmount) &&
            ((local_38->super_AStateProvider).super_AInventory.Amount =
                  ammo._4_4_ + (local_38->super_AStateProvider).super_AInventory.Amount,
            (local_38->super_AStateProvider).super_AInventory.MaxAmount <
            (local_38->super_AStateProvider).super_AInventory.Amount)) {
      (local_38->super_AStateProvider).super_AInventory.Amount =
           (local_38->super_AStateProvider).super_AInventory.MaxAmount;
    }
    this_local = local_38;
  }
  return (AAmmo *)this_local;
}

Assistant:

AAmmo *AWeapon::AddAmmo (AActor *other, PClassActor *ammotype, int amount)
{
	AAmmo *ammo;

	if (ammotype == NULL)
	{
		return NULL;
	}

	// [BC] This behavior is from the original Doom. Give 5/2 times as much ammo when
	// we pick up a weapon in deathmatch.
	if (( deathmatch ) && ( gameinfo.gametype & GAME_DoomChex ))
		amount = amount * 5 / 2;

	// extra ammo in baby mode and nightmare mode
	if (!(this->ItemFlags&IF_IGNORESKILL))
	{
		amount = int(amount * G_SkillProperty(SKILLP_AmmoFactor));
	}
	ammo = static_cast<AAmmo *>(other->FindInventory (ammotype));
	if (ammo == NULL)
	{
		ammo = static_cast<AAmmo *>(Spawn (ammotype));
		ammo->Amount = MIN (amount, ammo->MaxAmount);
		ammo->AttachToOwner (other);
	}
	else if (ammo->Amount < ammo->MaxAmount)
	{
		ammo->Amount += amount;
		if (ammo->Amount > ammo->MaxAmount)
		{
			ammo->Amount = ammo->MaxAmount;
		}
	}
	return ammo;
}